

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::global_object::make_object(global_object *this)

{
  gc_heap *args;
  undefined8 extraout_RDX;
  object *in_RSI;
  object_ptr oVar1;
  object local_48;
  undefined1 local_28 [8];
  object_ptr op;
  global_object *this_local;
  
  (*in_RSI->_vptr_object[0xb])(local_28);
  args = mjs::object::heap(in_RSI);
  gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_28);
  mjs::object::class_name(&local_48);
  gc_heap::make<mjs::object,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)this,(string *)args,(gc_heap_ptr<mjs::object> *)&local_48);
  string::~string((string *)&local_48);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_28);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr global_object::make_object() {
    auto op = object_prototype();
    return heap().make<object>(op->class_name(), op);
}